

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::setupTables(TranslateToFuzzReader *this)

{
  Random *pRVar1;
  pointer puVar2;
  pointer puVar3;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var4;
  char *pcVar5;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> uVar6;
  bool bVar7;
  uint32_t uVar8;
  _Head_base<0UL,_wasm::Table_*,_false> _Var9;
  pointer puVar10;
  size_t *psVar11;
  pointer puVar12;
  long lVar13;
  Module *pMVar14;
  long lVar15;
  pointer puVar16;
  ulong uVar17;
  Type TVar18;
  Address max;
  Name name;
  Name NVar19;
  Name NVar20;
  string_view local_98;
  string_view local_88;
  Literal local_78;
  string_view local_60;
  Address local_50;
  Address local_48;
  Type funcref;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> tablePtr_1;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> tablePtr;
  
  Type::Type((Type *)&local_48,(HeapType)0x10,Nullable,Inexact);
  pMVar14 = this->wasm;
  puVar10 = (pMVar14->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pMVar14->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)puVar2 - (long)puVar10;
  for (lVar15 = lVar13 >> 5; 0 < lVar15; lVar15 = lVar15 + -1) {
    if ((((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == local_48.addr)
    goto LAB_0014c579;
    if (((puVar10[1]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == local_48.addr) {
      puVar10 = puVar10 + 1;
      goto LAB_0014c579;
    }
    if (((puVar10[2]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == local_48.addr) {
      puVar10 = puVar10 + 2;
      goto LAB_0014c579;
    }
    if (((puVar10[3]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id == local_48.addr) {
      puVar10 = puVar10 + 3;
      goto LAB_0014c579;
    }
    puVar10 = puVar10 + 4;
    lVar13 = lVar13 + -0x20;
  }
  lVar13 = lVar13 >> 3;
  if (lVar13 == 1) {
LAB_0014c55c:
    if ((((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != local_48.addr) {
      puVar10 = puVar2;
    }
LAB_0014c579:
    if (puVar10 == puVar2) goto LAB_0014c586;
    _Var9._M_head_impl =
         (puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  }
  else {
    if (lVar13 == 2) {
LAB_0014c54f:
      if ((((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != local_48.addr) {
        puVar10 = puVar10 + 1;
        goto LAB_0014c55c;
      }
      goto LAB_0014c579;
    }
    if (lVar13 == 3) {
      if ((((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id != local_48.addr) {
        puVar10 = puVar10 + 1;
        goto LAB_0014c54f;
      }
      goto LAB_0014c579;
    }
LAB_0014c586:
    pRVar1 = &this->random;
    uVar8 = Random::upTo(pRVar1,10);
    uVar17 = (ulong)uVar8;
    bVar7 = Random::oneIn(pRVar1,2);
    if (bVar7) {
      uVar8 = Random::upTo(pRVar1,4);
      TVar18.id = uVar8 + uVar17;
    }
    else {
      TVar18.id = 0xffffffffffffffff;
    }
    pMVar14 = this->wasm;
    local_50.addr = uVar17;
    if (((pMVar14->features).features & 0x800) != 0) {
      Random::oneIn(pRVar1,2);
      pMVar14 = this->wasm;
    }
    Name::Name((Name *)&local_98,"fuzzing_table");
    NVar19 = Names::getValidTableName(pMVar14,(Name)local_98);
    NVar20.super_IString.str._M_str = NVar19.super_IString.str._M_len;
    NVar20.super_IString.str._M_len = (size_t)&tablePtr_1;
    Builder::makeTable(NVar20,(Type)NVar19.super_IString.str._M_str,local_48,local_50,TVar18);
    *(undefined1 *)
     ((long)tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) = 1;
    _Var9._M_head_impl = (Table *)wasm::Module::addTable((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&tablePtr_1);
    pMVar14 = this->wasm;
  }
  TVar18.id = 0xffffffffffffffff;
  pcVar5 = *(char **)((long)&((_Var9._M_head_impl)->super_Importable).super_Named + 8);
  (this->funcrefTableName).super_IString.str._M_len =
       *(size_t *)&((_Var9._M_head_impl)->super_Importable).super_Named;
  (this->funcrefTableName).super_IString.str._M_str = pcVar5;
  puVar12 = (pMVar14->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pMVar14->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)puVar3 - (long)puVar12;
  for (lVar15 = lVar13 >> 5; 0 < lVar15; lVar15 = lVar15 + -1) {
    _Var4._M_head_impl =
         (puVar12->_M_t).
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var4._M_head_impl)->table + 8) != (char *)0x0) &&
       (puVar16 = puVar12, ((_Var4._M_head_impl)->type).id == local_48.addr)) goto LAB_0014c747;
    _Var4._M_head_impl =
         puVar12[1]._M_t.
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var4._M_head_impl)->table + 8) != (char *)0x0) &&
       (((_Var4._M_head_impl)->type).id == local_48.addr)) {
      puVar16 = puVar12 + 1;
      goto LAB_0014c747;
    }
    _Var4._M_head_impl =
         puVar12[2]._M_t.
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var4._M_head_impl)->table + 8) != (char *)0x0) &&
       (((_Var4._M_head_impl)->type).id == local_48.addr)) {
      puVar16 = puVar12 + 2;
      goto LAB_0014c747;
    }
    _Var4._M_head_impl =
         puVar12[3]._M_t.
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var4._M_head_impl)->table + 8) != (char *)0x0) &&
       (((_Var4._M_head_impl)->type).id == local_48.addr)) {
      puVar16 = puVar12 + 3;
      goto LAB_0014c747;
    }
    puVar12 = puVar12 + 4;
    lVar13 = lVar13 + -0x20;
  }
  lVar13 = lVar13 >> 3;
  if (lVar13 == 1) {
LAB_0014c719:
    _Var4._M_head_impl =
         (puVar12->_M_t).
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    puVar16 = puVar3;
    if ((*(char **)((long)&(_Var4._M_head_impl)->table + 8) != (char *)0x0) &&
       (puVar16 = puVar12, ((_Var4._M_head_impl)->type).id != local_48.addr)) {
      puVar16 = puVar3;
    }
  }
  else if (lVar13 == 2) {
LAB_0014c705:
    _Var4._M_head_impl =
         (puVar12->_M_t).
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var4._M_head_impl)->table + 8) == (char *)0x0) ||
       (puVar16 = puVar12, ((_Var4._M_head_impl)->type).id != local_48.addr)) {
      puVar12 = puVar12 + 1;
      goto LAB_0014c719;
    }
  }
  else {
    puVar16 = puVar3;
    if ((lVar13 == 3) &&
       ((_Var4._M_head_impl =
              (puVar12->_M_t).
              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl,
        *(char **)((long)&(_Var4._M_head_impl)->table + 8) == (char *)0x0 ||
        (puVar16 = puVar12, ((_Var4._M_head_impl)->type).id != local_48.addr)))) {
      puVar12 = puVar12 + 1;
      goto LAB_0014c705;
    }
  }
LAB_0014c747:
  NVar19.super_IString.str._M_str = (char *)(this->funcrefTableName).super_IString.str._M_len;
  NVar19.super_IString.str._M_len = (size_t)pMVar14;
  lVar13 = wasm::Module::getTable(NVar19);
  if (puVar16 == puVar3) {
    Literal::makeFromInt32(&local_78,0,(Type)*(uintptr_t *)(lVar13 + 0x48));
    funcref.id = (uintptr_t)Builder::makeConst(&this->builder,&local_78);
    std::make_unique<wasm::ElementSegment,wasm::Name&,wasm::Const*>
              ((Name *)&tablePtr_1,(Const **)_Var9._M_head_impl);
    wasm::Literal::~Literal(&local_78);
    uVar6 = tablePtr_1;
    pMVar14 = this->wasm;
    Name::Name((Name *)&local_60,"elem$");
    NVar20 = Names::getValidElementSegmentName(pMVar14,(Name)local_60);
    *(IString *)
     uVar6._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = NVar20.super_IString.str;
    *(undefined1 *)
     ((long)uVar6._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) = 0;
    wasm::Module::addElementSegment((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
              ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
               &tablePtr_1);
  }
  if (((this->wasm->features).features & 0x40) == 0) {
    return;
  }
  Type::Type((Type *)&tablePtr_1,(HeapType)0x48,Nullable,Inexact);
  puVar10 = (this->wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)puVar2 - (long)puVar10;
  for (lVar15 = lVar13 >> 5; 0 < lVar15; lVar15 = lVar15 + -1) {
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        (((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id ==
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) goto LAB_0014c8b0;
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        ((puVar10[1]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id ==
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) {
      puVar10 = puVar10 + 1;
      goto LAB_0014c8b0;
    }
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        ((puVar10[2]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id ==
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) {
      puVar10 = puVar10 + 2;
      goto LAB_0014c8b0;
    }
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        ((puVar10[3]._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id ==
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) {
      puVar10 = puVar10 + 3;
      goto LAB_0014c8b0;
    }
    puVar10 = puVar10 + 4;
    lVar13 = lVar13 + -0x20;
  }
  lVar13 = lVar13 >> 3;
  if (lVar13 == 1) {
LAB_0014c893:
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        (((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) {
      puVar10 = puVar2;
    }
  }
  else if (lVar13 == 2) {
LAB_0014c886:
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        (((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) {
      puVar10 = puVar10 + 1;
      goto LAB_0014c893;
    }
  }
  else {
    if (lVar13 != 3) goto LAB_0014c8c4;
    if ((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
        (((puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        tablePtr_1._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl) {
      puVar10 = puVar10 + 1;
      goto LAB_0014c886;
    }
  }
LAB_0014c8b0:
  if (puVar10 != puVar2) {
    _Var9._M_head_impl =
         (puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar5 = *(char **)((long)&(_Var9._M_head_impl)->super_Importable + 8);
    (this->exnrefTableName).super_IString.str._M_len =
         *(size_t *)&(_Var9._M_head_impl)->super_Importable;
    (this->exnrefTableName).super_IString.str._M_str = pcVar5;
    return;
  }
LAB_0014c8c4:
  pRVar1 = &this->random;
  uVar8 = Random::upTo(pRVar1,10);
  max.addr._4_4_ = 0;
  max.addr._0_4_ = uVar8;
  bVar7 = Random::oneIn(pRVar1,2);
  if (bVar7) {
    uVar8 = Random::upTo(pRVar1,4);
    TVar18.id = uVar8 + max.addr;
  }
  pMVar14 = this->wasm;
  Name::Name((Name *)&local_88,"exnref_table");
  NVar20 = Names::getValidTableName(pMVar14,(Name)local_88);
  name.super_IString.str._M_str = NVar20.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&funcref;
  Builder::makeTable(name,(Type)NVar20.super_IString.str._M_str,
                     (Address)tablePtr_1._M_t.
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,max,TVar18);
  *(undefined1 *)(funcref.id + 0x10) = 1;
  psVar11 = (size_t *)wasm::Module::addTable((unique_ptr *)this->wasm);
  pcVar5 = (char *)psVar11[1];
  (this->exnrefTableName).super_IString.str._M_len = *psVar11;
  (this->exnrefTableName).super_IString.str._M_str = pcVar5;
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
            ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&funcref);
  return;
}

Assistant:

void TranslateToFuzzReader::setupTables() {
  // Ensure a funcref element segment and table exist. Segments with more
  // specific function types may have a smaller chance of getting functions.
  Table* table = nullptr;
  Type funcref = Type(HeapType::func, Nullable);
  auto iter = std::find_if(wasm.tables.begin(),
                           wasm.tables.end(),
                           [&](auto& table) { return table->type == funcref; });
  if (iter != wasm.tables.end()) {
    table = iter->get();
  } else {
    // Start from a potentially empty table.
    Address initial = upTo(10);
    // Make the max potentially higher, or unlimited.
    Address max;
    if (oneIn(2)) {
      max = initial + upTo(4);
    } else {
      max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    auto addressType = Type::i32;
    if (wasm.features.hasMemory64() && oneIn(2)) {
      addressType = Type::i64;
    }
    auto tablePtr =
      builder.makeTable(Names::getValidTableName(wasm, "fuzzing_table"),
                        funcref,
                        initial,
                        max,
                        addressType);
    tablePtr->hasExplicitName = true;
    table = wasm.addTable(std::move(tablePtr));
  }
  funcrefTableName = table->name;
  bool hasFuncrefElemSegment =
    std::any_of(wasm.elementSegments.begin(),
                wasm.elementSegments.end(),
                [&](auto& segment) {
                  return segment->table.is() && segment->type == funcref;
                });
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  if (!hasFuncrefElemSegment) {
    // TODO: use a random table
    auto segment = std::make_unique<ElementSegment>(
      table->name, builder.makeConst(Literal::makeFromInt32(0, addressType)));
    segment->setName(Names::getValidElementSegmentName(wasm, "elem$"), false);
    wasm.addElementSegment(std::move(segment));
  }

  // When EH is enabled, set up an exnref table.
  if (wasm.features.hasExceptionHandling()) {
    Type exnref = Type(HeapType::exn, Nullable);
    auto iter =
      std::find_if(wasm.tables.begin(), wasm.tables.end(), [&](auto& table) {
        return table->type == exnref;
      });
    if (iter != wasm.tables.end()) {
      // Use the existing one.
      exnrefTableName = iter->get()->name;
    } else {
      // Create a new exnref table.
      Address initial = upTo(10);
      Address max = oneIn(2) ? initial + upTo(4) : Memory::kUnlimitedSize;
      auto tablePtr =
        builder.makeTable(Names::getValidTableName(wasm, "exnref_table"),
                          exnref,
                          initial,
                          max,
                          Type::i32); // TODO: wasm64
      tablePtr->hasExplicitName = true;
      table = wasm.addTable(std::move(tablePtr));
      exnrefTableName = table->name;
    }
  }
}